

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O1

double testKalmanFilterZeroInput(void)

{
  double *pdVar1;
  double *pdVar2;
  double **ppdVar3;
  double dVar4;
  Scalar SVar5;
  double dVar6;
  Index IVar7;
  undefined8 uVar8;
  Index size;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar9;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar10;
  undefined8 *puVar11;
  char *pcVar12;
  Index index;
  double dVar13;
  ulong uVar14;
  uint uVar15;
  double *pdVar16;
  long lVar17;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  undefined4 uVar18;
  undefined4 uVar19;
  MeasureVector w;
  type tmp;
  Pmatrix p;
  StateVector x;
  StateVector xh;
  Qmatrix q1;
  StateVector error;
  Rmatrix r;
  Cmatrix c;
  Rmatrix r1;
  InputVector u;
  Qmatrix q;
  Dmatrix d;
  Bmatrix b;
  filter f;
  Matrix<double,_4,_4,_0,_4,_4> a;
  StateVector xk [1001];
  MeasureVector yk [1000];
  lagged_fibonacci1279 gen_;
  long local_a9f8;
  undefined1 local_a9f0 [24];
  undefined1 local_a9d8 [48];
  undefined1 local_a9a8 [32];
  double local_a988;
  undefined1 *local_a980;
  double local_a978;
  undefined1 local_a970 [24];
  Matrix<double,_4,_4,_0,_4,_4> *local_a958;
  double local_a950;
  undefined1 local_a948 [32];
  LhsNested local_a928;
  double local_a920;
  undefined1 local_a918 [64];
  void *local_a8d8 [3];
  void *local_a8c0 [3];
  void *local_a8a8 [3];
  code *local_a890 [30];
  double local_a7a0;
  void *local_a5f8;
  undefined8 uStack_a5f0;
  undefined8 local_a5e8;
  void *pvStack_a5e0;
  undefined8 local_a5d8;
  undefined8 uStack_a5d0;
  Matrix<double,_4,_4,_0,_4,_4> local_a5c8;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_a548 [500];
  Matrix<double,_4,_4,_0,_4,_4> local_66c8 [125];
  lagged_fibonacci_01_engine<double,_48,_1279U,_418U> local_2830;
  
  stateObservation::KalmanFilterBase::KalmanFilterBase((KalmanFilterBase *)local_a890,4,3,0);
  local_a918._24_8_ = stateObservation::KalmanFilterBase::setR;
  local_a890[0] = stateObservation::KalmanFilterBase::setR;
  local_a918._32_8_ = 5.83187183300674e-318;
  local_a7a0 = 5.83187183300674e-318;
  local_a5f8 = (void *)0x0;
  uStack_a5f0 = 0;
  local_a5e8 = 0;
  pvStack_a5e0 = (void *)0x0;
  local_a5d8 = 0;
  uStack_a5d0 = 0;
  local_a548[0].m_xpr = &local_a5c8;
  local_a548[0].m_row = 0;
  local_a548[0].m_col = 1;
  local_a548[0].m_currentBlockRows = 1;
  local_a5c8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       = -0.6785714;
  local_66c8[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [2] = 0.1156463;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (local_a548,
                      local_66c8[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array + 2);
  local_2830.i = 0x298d9804;
  local_2830._4_4_ = 0x3fdc1cb3;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar9,(Scalar *)&local_2830);
  local_a9d8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)0x3fd2544a04301069;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar9,(Scalar *)local_a9d8);
  local_a8a8[0] = (void *)0x3fb626de911a6f17;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar9,(Scalar *)local_a8a8);
  local_a948._24_8_ = (void *)0xbf9c09c3ce2089e3;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar9,(Scalar *)(local_a948 + 0x18));
  local_a8c0[0] = (void *)0x3fd578ffc61e5ce2;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar9,(Scalar *)local_a8c0);
  local_a918._0_8_ = (double *)0x3f92db61bb05faec;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar9,(Scalar *)local_a918);
  local_a970._0_8_ = (void *)0xbfdab4b28f33e50a;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar9,(Scalar *)local_a970);
  local_a948._0_8_ = (void *)0xbfca11f926c7eae6;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar9,(Scalar *)local_a948);
  local_a8d8[0] = (void *)0xbfdc60b044000a11;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar9,(Scalar *)local_a8d8);
  local_a9a8._0_8_ = &DAT_bfd1111134dba9df;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar9,(Scalar *)local_a9a8);
  local_a9f0._0_8_ = &DAT_3fdae264e48626f6;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar9,(Scalar *)local_a9f0);
  local_a9a8._24_8_ = &DAT_3fe13d1782d38477;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar9,(Scalar *)(local_a9a8 + 0x18));
  local_a918._48_8_ = &DAT_3fdf4168eb7be47d;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar9,(Scalar *)(local_a918 + 0x30));
  local_a980 = &DAT_bfe3280cf9e3864d;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
            (pCVar9,(Scalar *)&local_a980);
  if ((local_a548[0].m_currentBlockRows + local_a548[0].m_row != 4) || (local_a548[0].m_col != 4)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 4>>::finished() [MatrixType = Eigen::Matrix<double, 4, 4>]"
                 );
  }
  stateObservation::LinearKalmanFilter::getBmatrixRandom();
  stateObservation::KalmanFilterBase::getCmatrixRandom();
  stateObservation::LinearKalmanFilter::getDmatrixRandom();
  memset(local_a548,0,0x3e90);
  memset(local_66c8[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
         .array + 2,0,16000);
  stateObservation::ObserverBase::stateVectorZero();
  dVar13 = local_a988;
  uVar8 = local_a9a8._24_8_;
  if ((double)local_a548[0].m_row != local_a988) {
    if ((long)local_a988 < 0) {
LAB_00109645:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    free(local_a548[0].m_xpr);
    if (dVar13 == 0.0) {
      pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
    }
    else {
      if ((ulong)dVar13 >> 0x3d != 0) {
LAB_00108cf1:
        puVar11 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar11 = operator_delete;
        __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)malloc((long)dVar13 * 8);
      if (dVar13 != 4.94065645841247e-324 && ((ulong)pMVar10 & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pMVar10 == (Matrix<double,_4,_4,_0,_4,_4> *)0x0) goto LAB_00108cf1;
    }
    local_a548[0].m_row = (Index)dVar13;
    local_a548[0].m_xpr = pMVar10;
  }
  if ((double)local_a548[0].m_row == dVar13) {
    dVar13 = (double)(local_a548[0].m_row - (local_a548[0].m_row >> 0x3f) & 0xfffffffffffffffe);
    if (1 < local_a548[0].m_row) {
      lVar17 = 0;
      do {
        pdVar16 = (double *)(uVar8 + lVar17 * 8);
        dVar4 = pdVar16[1];
        pdVar1 = ((local_a548[0].m_xpr)->
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                 array + lVar17;
        *pdVar1 = *pdVar16;
        pdVar1[1] = dVar4;
        lVar17 = lVar17 + 2;
      } while (lVar17 < (long)dVar13);
    }
    if ((long)dVar13 < local_a548[0].m_row) {
      do {
        ((local_a548[0].m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
        m_storage.m_data.array[(long)dVar13] = *(double *)(uVar8 + (long)dVar13 * 8);
        dVar13 = (double)((long)dVar13 + 1);
      } while ((double)local_a548[0].m_row != dVar13);
    }
    boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::seed
              (&local_2830,
               &boost::random::lagged_fibonacci_01_engine<double,48,1279u,418u>::default_seed);
    stateObservation::KalmanFilterBase::getRmatrixRandom();
    if (-1 < (long)(local_a970._16_8_ | local_a970._8_8_)) {
      local_a9d8._8_8_ = local_a970._8_8_;
      local_a9d8._16_8_ = local_a970._16_8_;
      local_a9d8._24_8_ = 0.01;
      local_a9d8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)local_a970;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a918,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)local_a9d8);
      free((void *)local_a970._0_8_);
      stateObservation::KalmanFilterBase::getQmatrixRandom();
      if (-1 < (long)(local_a948._16_8_ | local_a948._8_8_)) {
        local_a9d8._8_8_ = local_a948._8_8_;
        local_a9d8._16_8_ = local_a948._16_8_;
        local_a9d8._24_8_ = 0.01;
        local_a9d8._0_8_ = (LhsNested)local_a948;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a970,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)local_a9d8);
        free((void *)local_a948._0_8_);
        local_a9d8._0_8_ = local_a918;
        local_a9d8._8_8_ = local_a9d8._0_8_;
        Eigen::Matrix<double,-1,-1,0,-1,-1>::
        Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_a948,
                   (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                    *)local_a9d8);
        local_a9d8._0_8_ = local_a970;
        local_a9d8._8_8_ = local_a9d8._0_8_;
        Eigen::Matrix<double,-1,-1,0,-1,-1>::
        Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_a8d8,
                   (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                    *)local_a9d8);
        stateObservation::ObserverBase::inputVectorZero();
        local_a9f8 = 1;
        do {
          stateObservation::ObserverBase::stateVectorZero();
          uVar15 = 0;
          while( true ) {
            lVar17 = stateObservation::ObserverBase::getStateSize();
            uVar14 = (ulong)uVar15;
            if (lVar17 <= (long)uVar14) break;
            dVar13 = boost::random::detail::unit_normal_distribution<double>::operator()
                               ((unit_normal_distribution<double> *)local_a9d8,&local_2830);
            if ((long)local_a9a8._8_8_ <= (long)uVar14) goto LAB_0010957c;
            *(double *)(local_a9a8._0_8_ + uVar14 * 8) = dVar13 + 0.0;
            uVar15 = uVar15 + 1;
          }
          if (local_a970._16_8_ != local_a9a8._8_8_) {
LAB_0010959b:
            pcVar12 = 
            "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
            ;
LAB_0010961c:
            __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                          ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar12);
          }
          local_a9d8._0_8_ = local_a970;
          local_a9d8._8_8_ = local_a9a8;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)local_a9d8._8_8_,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                      *)local_a9d8,(assign_op<double,_double> *)local_a9f0,(type)0x0);
          stateObservation::ObserverBase::measureVectorZero();
          uVar15 = 0;
          while( true ) {
            lVar17 = stateObservation::ObserverBase::getMeasureSize();
            uVar14 = (ulong)uVar15;
            if (lVar17 <= (long)uVar14) break;
            dVar13 = boost::random::detail::unit_normal_distribution<double>::operator()
                               ((unit_normal_distribution<double> *)local_a9d8,&local_2830);
            if ((long)local_a9f0._8_8_ <= (long)uVar14) goto LAB_0010957c;
            (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a9f0._0_8_)->
              m_storage).m_data)[uVar14] = (double *)(dVar13 + 0.0);
            uVar15 = uVar15 + 1;
          }
          if (local_a918._16_8_ != local_a9f0._8_8_) goto LAB_0010959b;
          local_a9d8._0_8_ = local_a918;
          local_a9d8._8_8_ = local_a9f0;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)local_a9d8._8_8_,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                      *)local_a9d8,(assign_op<double,_double> *)&local_a980,(type)0x0);
          pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)(local_a9a8 + 0x18);
          if (local_a988 != 1.97626258336499e-323) {
            pcVar12 = 
            "Eigen::Product<Eigen::Matrix<double, 4, 4>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 4, 4>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
            ;
            goto LAB_0010961c;
          }
          local_a9d8._0_8_ = &local_a5c8;
          local_a9d8._16_8_ = local_a9a8;
          local_a9d8._8_8_ = pMVar10;
          if ((RhsNested)local_a9a8._8_8_ != (RhsNested)0x4) {
            pcVar12 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, 4, 4>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Product<Eigen::Matrix<double, 4, 4>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_001095fd;
          }
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)pMVar10,
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_a9d8,(assign_op<double,_double> *)&local_a980);
          dVar13 = local_a988;
          uVar8 = local_a9a8._24_8_;
          local_a918._40_8_ = local_a9f8 * 0x10;
          if ((double)(&local_a548[0].m_row)[local_a9f8 * 2] != local_a988) {
            if ((long)local_a988 < 0) goto LAB_00109645;
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                      ((DenseStorage<double,__1,__1,_1,_0> *)(&local_a548[0].m_xpr + local_a9f8 * 2)
                       ,(Index)local_a988,(Index)local_a988,1);
          }
          dVar4 = (double)(&local_a548[0].m_row)[local_a9f8 * 2];
          if (dVar4 != dVar13) goto LAB_001095b2;
          pdVar16 = ((DenseStorage<double,__1,__1,_1,_0> *)(&local_a548[0].m_xpr + local_a9f8 * 2))
                    ->m_data;
          dVar13 = (double)((long)dVar4 - ((long)dVar4 >> 0x3f) & 0xfffffffffffffffe);
          if (1 < (long)dVar4) {
            lVar17 = 0;
            do {
              pdVar1 = (double *)(uVar8 + lVar17 * 8);
              dVar6 = pdVar1[1];
              pdVar2 = pdVar16 + lVar17;
              *pdVar2 = *pdVar1;
              pdVar2[1] = dVar6;
              lVar17 = lVar17 + 2;
            } while (lVar17 < (long)dVar13);
          }
          if ((long)dVar13 < (long)dVar4) {
            do {
              pdVar16[(long)dVar13] = *(double *)(uVar8 + (long)dVar13 * 8);
              dVar13 = (double)((long)dVar13 + 1);
            } while (dVar4 != dVar13);
          }
          if (local_a920 != local_a988) goto LAB_0010959b;
          local_a9d8._0_8_ = local_a948 + 0x18;
          local_a9d8._8_8_ = local_a9a8 + 0x18;
          local_a9d8._16_8_ = local_a9f0;
          if (local_a928 != (LhsNested)local_a9f0._8_8_) {
            pcVar12 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_001095fd;
          }
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)
                     ((long)local_66c8[0].
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                            m_data.array + local_a918._40_8_),
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_a9d8,(assign_op<double,_double> *)&local_a980);
          free((void *)local_a9f0._0_8_);
          free((void *)local_a9a8._0_8_);
          local_a9f8 = local_a9f8 + 1;
        } while (local_a9f8 != 0x3e9);
        stateObservation::ObserverBase::stateVectorRandom();
        stateObservation::ZeroDelayObserver::setState((Matrix *)local_a890,(long)&local_a980);
        stateObservation::KalmanFilterBase::getPmatrixZero();
        for (uVar14 = 0; lVar17 = stateObservation::ObserverBase::getStateSize(),
            (long)uVar14 < lVar17; uVar14 = (ulong)((int)uVar14 + 1)) {
          if ((long)local_a978 <= (long)uVar14) {
LAB_0010957c:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          if (((long)local_a9a8._8_8_ <= (long)uVar14) || ((long)local_a9a8._16_8_ <= (long)uVar14))
          {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                         );
          }
          *(double *)(local_a9a8._0_8_ + (local_a9a8._8_8_ * uVar14 + uVar14) * 8) =
               *(double *)(local_a980 + uVar14 * 8);
        }
        local_a9f0._0_8_ = (LhsNested)local_a9a8;
        local_a9f0._8_8_ = (LhsNested)local_a9a8;
        Eigen::Matrix<double,-1,-1,0,-1,-1>::
        Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_a9d8,
                   (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                    *)local_a9f0);
        pdVar16 = local_66c8[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                  m_storage.m_data.array;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_a9a8,
                   (Matrix<double,__1,__1,_0,__1,__1> *)local_a9d8,
                   (assign_op<double,_double> *)&local_a958);
        free((void *)local_a9d8._0_8_);
        stateObservation::KalmanFilterBase::setStateCovariance((Matrix *)local_a890);
        local_a9d8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
        local_a9d8._8_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
        local_a9d8._16_8_ = (RhsNested)0x0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)local_a9d8,0x10,4,4);
        if (((Matrix<double,_4,_4,_0,_4,_4> *)local_a9d8._8_8_ !=
             (Matrix<double,_4,_4,_0,_4,_4> *)0x4) ||
           ((RhsNested)local_a9d8._16_8_ != (RhsNested)0x4)) {
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                    ((DenseStorage<double,__1,__1,__1,_0> *)local_a9d8,0x10,4,4);
        }
        if (((Matrix<double,_4,_4,_0,_4,_4> *)local_a9d8._8_8_ ==
             (Matrix<double,_4,_4,_0,_4,_4> *)0x4) &&
           ((RhsNested)local_a9d8._16_8_ == (RhsNested)0x4)) {
          uVar14 = 0xfffffffffffffffe;
          do {
            IVar7 = (Index)local_a5c8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                           m_storage.m_data.array[uVar14 + 3];
            ppdVar3 = (double **)
                      ((((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_a9d8._0_8_)
                       ->m_storage).m_data.array + uVar14 + 2);
            *ppdVar3 = (double *)
                       local_a5c8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[uVar14 + 2];
            ppdVar3[1] = (double *)IVar7;
            uVar14 = uVar14 + 2;
          } while (uVar14 < 0xe);
          stateObservation::KalmanFilterBase::setA((Matrix *)local_a890);
          free((void *)local_a9d8._0_8_);
          stateObservation::LinearKalmanFilter::setB((Matrix *)local_a890);
          stateObservation::KalmanFilterBase::setC((Matrix *)local_a890);
          stateObservation::LinearKalmanFilter::setD((Matrix *)local_a890);
          stateObservation::KalmanFilterBase::setR((Matrix *)local_a890);
          stateObservation::KalmanFilterBase::setQ((Matrix *)local_a890);
          lVar17 = 1;
          do {
            pdVar16 = (double *)((long)pdVar16 + 0x10);
            stateObservation::ZeroDelayObserver::setMeasurement((Matrix *)local_a890,(long)pdVar16);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x3e9);
          stateObservation::ZeroDelayObserver::getEstimatedState((long)local_a9f0);
          local_a9d8._8_8_ = local_66c8;
          local_a9d8._0_8_ = (Matrix<double,_4,_4,_0,_4,_4> *)local_a9f0;
          if ((double)local_a9f0._8_8_ ==
              local_66c8[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[1]) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_a958,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_a9d8);
            free((void *)local_a9f0._0_8_);
            local_a9f0._0_8_ = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_a958;
            if (local_a950 == 0.0) {
              uVar18 = 0;
              uVar19 = 0;
            }
            else {
              if ((long)local_a950 < 1) {
                __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\""
                              ,"/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                             );
              }
              local_a9d8._8_8_ = local_a958;
              SVar5 = Eigen::internal::
                      redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                      ::
                      run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  *)local_a9d8,(scalar_sum_op<double,_double> *)(local_a9f0 + 0x17),
                                 (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                  *)local_a9f0);
              uVar18 = SUB84(SVar5,0);
              uVar19 = (undefined4)((ulong)SVar5 >> 0x20);
            }
            free(local_a958);
            free((void *)local_a9a8._0_8_);
            free(local_a980);
            free((void *)local_a918._48_8_);
            free(local_a8d8[0]);
            free((void *)local_a948._0_8_);
            free((void *)local_a970._0_8_);
            free((void *)local_a918._0_8_);
            free((void *)local_a9a8._24_8_);
            lVar17 = 16000;
            do {
              free(*(void **)((long)local_66c8[0].
                                    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array + lVar17));
              lVar17 = lVar17 + -0x10;
            } while (lVar17 != 0);
            lVar17 = 0x3e90;
            do {
              free(*(void **)((long)local_a5c8.
                                    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                    m_storage.m_data.array + lVar17 + 0x70));
              lVar17 = lVar17 + -0x10;
            } while (lVar17 != 0);
            free(local_a8c0[0]);
            free((void *)local_a948._24_8_);
            free(local_a8a8[0]);
            local_a890[0] = (code *)local_a918._24_8_;
            local_a7a0 = (double)local_a918._32_8_;
            free(pvStack_a5e0);
            free(local_a5f8);
            stateObservation::KalmanFilterBase::~KalmanFilterBase((KalmanFilterBase *)local_a890);
            return SQRT((double)CONCAT44(uVar19,uVar18));
          }
          pcVar12 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
LAB_001095fd:
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar12);
        }
        pcVar12 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 4, 4>, T1 = double, T2 = double]"
        ;
        goto LAB_001095c7;
      }
    }
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                 );
  }
LAB_001095b2:
  pcVar12 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
  ;
LAB_001095c7:
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar12);
}

Assistant:

double testKalmanFilterZeroInput()
{
  typedef stateObservation::LinearKalmanFilter filter;

  filter f(4, 3);
  Eigen::Matrix<double, 4, 4> a;

  a << -0.6785714, 0.1156463, 0.4392517, 0.2863946, 0.0865306, -0.0273810, 0.3355102, 0.0184150, -0.4172789, -0.2036735,
      -0.4434014, -0.2666667, 0.4200680, 0.5387075, 0.4883673, -0.598639;

  filter::Bmatrix b = f.getBmatrixRandom();
  filter::Cmatrix c = f.getCmatrixRandom();
  filter::Dmatrix d = f.getDmatrixRandom();

  const stateObservation::Index kmax = 1000;

  filter::StateVector xk[kmax + 1];
  filter::MeasureVector yk[kmax];

  filter::StateVector x = f.stateVectorZero();

  xk[0] = x;

  boost::lagged_fibonacci1279 gen_;

  filter::Rmatrix r1 = f.getRmatrixRandom() * 0.01;

  filter::Qmatrix q1 = f.getQmatrixRandom() * 0.01;

  filter::Rmatrix r(r1 * r1.transpose());
  filter::Qmatrix q(q1 * q1.transpose());

  filter::InputVector u = f.inputVectorZero();

  for(stateObservation::Index k = 1; k <= kmax; ++k)
  {

    filter::StateVector v = f.stateVectorZero();
    for(unsigned i = 0; i < f.getStateSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      v[i] = g(gen_);
    }
    v = q1 * v;

    filter::MeasureVector w = f.measureVectorZero();
    for(unsigned i = 0; i < f.getMeasureSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      w[i] = g(gen_);
    }
    w = r1 * w;

    xk[k] = x = a * x + v;
    yk[k - 1] = c * x + w;
  }

  filter::StateVector xh = f.stateVectorRandom();

  f.setState(xh, 0);

  filter::Pmatrix p = f.getPmatrixZero();

  for(unsigned i = 0; i < f.getStateSize(); ++i)
  {
    p(i, i) = xh[i];
  }
  p = p * p.transpose();

  f.setStateCovariance(p);

  f.setA(a);
  f.setB(b);
  f.setC(c);
  f.setD(d);

  f.setR(r);
  f.setQ(q);

  stateObservation::Index i;

  for(i = 1; i <= kmax; ++i)
  {
    f.setMeasurement(yk[i - 1], i);
  }

  filter::StateVector error = f.getEstimatedState(kmax) - xk[kmax];

  return error.norm();
}